

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_DEFI(Context *ctx)

{
  int32 *x;
  char varname [64];
  Context *ctx_local;
  
  get_METAL_destarg_varname(ctx,(char *)&x,0x40);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const int4 %s = int4(%d, %d, %d, %d);",&x,(ulong)ctx->dwords[0],
              (ulong)ctx->dwords[1],(ulong)ctx->dwords[2],ctx->dwords[3]);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_METAL_DEFI(Context *ctx)
{
    char varname[64]; get_METAL_destarg_varname(ctx, varname, sizeof (varname));
    const int32 *x = (const int32 *) ctx->dwords;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const int4 %s = int4(%d, %d, %d, %d);",
                varname, (int) x[0], (int) x[1], (int) x[2], (int) x[3]);
    pop_output(ctx);
}